

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BpTree2.h
# Opt level: O1

void __thiscall Ext_IndexNode<int>::Ext_IndexNode(Ext_IndexNode<int> *this,int N)

{
  allocator_type local_49;
  vector<Addr,_std::allocator<Addr>_> local_48;
  
  (this->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  (this->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->k).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  (this->k).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (this->k).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  (this->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_48,(long)N,&local_49);
  std::vector<int,_std::allocator<int>_>::_M_move_assign(&this->k,&local_48);
  if (local_48.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)&local_48,(long)N,(allocator_type *)&local_49);
  std::vector<char,_std::allocator<char>_>::_M_move_assign(&this->v,&local_48);
  if (local_48.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<Addr,_std::allocator<Addr>_>::vector
            (&local_48,(long)(N + 1),(allocator_type *)&local_49);
  std::vector<Addr,_std::allocator<Addr>_>::_M_move_assign(&this->p,&local_48);
  if (local_48.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

Ext_IndexNode(int N) {
		k = vector<K>(N);
		v = vector<char>(N);
		p = vector<Addr>(N + 1);
	}